

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

_Bool Curl_bufq_peek(bufq *q,uchar **pbuf,size_t *plen)

{
  _Bool _Var1;
  size_t *plen_local;
  uchar **pbuf_local;
  bufq *q_local;
  
  if ((q->head != (buf_chunk *)0x0) && (_Var1 = chunk_is_empty(q->head), _Var1)) {
    prune_head(q);
  }
  if ((q->head == (buf_chunk *)0x0) || (_Var1 = chunk_is_empty(q->head), _Var1)) {
    *pbuf = (uchar *)0x0;
    *plen = 0;
    q_local._7_1_ = false;
  }
  else {
    chunk_peek(q->head,pbuf,plen);
    q_local._7_1_ = true;
  }
  return q_local._7_1_;
}

Assistant:

bool Curl_bufq_peek(struct bufq *q,
                    const unsigned char **pbuf, size_t *plen)
{
  if(q->head && chunk_is_empty(q->head)) {
    prune_head(q);
  }
  if(q->head && !chunk_is_empty(q->head)) {
    chunk_peek(q->head, pbuf, plen);
    return TRUE;
  }
  *pbuf = NULL;
  *plen = 0;
  return FALSE;
}